

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void phmap::priv::
     InitializerListBucketAllocTest<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
               (void)

{
  size_t sz;
  long lVar1;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *pcVar2;
  Generator<std::pair<const_int,_int>,_void> gen;
  A alloc;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  m;
  AssertHelper local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  Generator<std::pair<const_int,_int>,_void> local_529;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_528;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  undefined8 uStack_500;
  long local_4f8;
  undefined4 local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e8;
  undefined8 uStack_4e0;
  long local_4d8;
  Alloc<std::pair<const_int,_int>_> local_4d0;
  pair<const_int,_int> local_4c8;
  pair<const_int,_int> local_4c0;
  pair<const_int,_int> local_4b8;
  pair<const_int,_int> local_4b0;
  pair<const_int,_int> local_4a8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_4a0;
  
  local_4c8 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_529);
  local_4c0 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_529);
  local_4b8 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_529);
  local_4b0 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_529);
  local_4a8 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(&local_529);
  local_4d0.id_ = 0;
  local_510._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                        next_id<phmap::priv::StatefulTestingEqual>()::gId->first + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::parallel_hash_set<std::pair<int_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_4a0,&local_4c8,(pair<const_int,_int> *)&local_4a0,0x7b,(hasher *)&local_510,
             (key_equal *)&local_528,&local_4d0);
  local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_4a0.sets_._M_elems[0].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .
                super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>.
                super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>.
                _M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<int_const,int>>,phmap::priv::Alloc<std::pair<int_const,int>>>
            ((internal *)&local_510,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_int,_int>_> *)&local_528,&local_4d0);
  if (local_510._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_528);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_528.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  local_4f0 = 3;
  std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>::
  vector<std::pair<int_const,int>const*,void>
            ((vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>> *)&local_4e8
             ,&local_4c8,(pair<const_int,_int> *)&local_4a0,(allocator_type *)&local_528);
  local_4f8 = local_4d8;
  uStack_500 = uStack_4e0;
  local_508 = local_4e8;
  local_4e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uStack_4e0 = 0;
  local_4d8 = 0;
  local_510._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_4f0;
  items<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
            (&local_528,(priv *)&local_4a0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(&local_540,(char *)&local_510,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  if (local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_508,local_4f8 - (long)local_508);
  }
  if (local_4e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4e8,local_4d8 - (long)local_4e8);
  }
  if ((char)local_540.data_ == '\0') {
    testing::Message::Message((Message *)&local_510);
    if (local_538 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_538->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_528,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_528);
    if (local_510._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_510._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_538 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_538,local_538);
  }
  lVar1 = 0x18;
  local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)((long)&(local_528.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first +
                  *(long *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar1));
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_540.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)&local_510,"m.bucket_count()","123",(unsigned_long *)&local_528,
             (int *)&local_540);
  if (local_510._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_528);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_528.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_528.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_4a0);
  return;
}

Assistant:

void InitializerListBucketAllocTest(std::true_type) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using A = typename TypeParam::allocator_type;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  A alloc(0);
  TypeParam m(values, 123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}